

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

int __thiscall QAccessibleMainWindow::childCount(QAccessibleMainWindow *this)

{
  int iVar1;
  QWidget *widget;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  widget = &mainWindow(this)->super_QWidget;
  _q_ac_childWidgets((QWidgetList *)&local_38,widget);
  iVar1 = (int)local_38.size;
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMainWindow::childCount() const
{
    QList<QWidget*> kids = _q_ac_childWidgets(mainWindow());
    return kids.size();
}